

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  int numDrawCalls;
  size_type sVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  deUint64 dVar5;
  reference pvVar6;
  deUint64 readFinishTime;
  deUint64 readStartTime;
  deUint64 waitStartTime;
  deUint64 submitStartTime;
  ulong uStack_210;
  int drawCallCount;
  size_t ndx;
  Random rnd;
  CalibrationFailedException *e;
  int iStack_50;
  int calibrationRoundNdx;
  CalibrationParams params;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample> local_31;
  undefined1 local_30 [8];
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  samples;
  FlushFinishCase *this_local;
  
  samples.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>::allocator
            (&local_31);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ::vector((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
            *)local_30,0x32,&local_31);
  std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>::
  ~allocator(&local_31);
  tcu::warmupCPU();
  setupRenderState(this);
  setShaderIterCount(this,1);
  render(this,1);
  readPixels(this);
  tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  _iStack_50 = calibrate(this);
  verifyCalibration(this,(CalibrationParams *)&stack0xffffffffffffffb0);
  de::Random::Random((Random *)((long)&ndx + 4),0x7b);
  setShaderIterCount(this,iStack_50);
  uStack_210 = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
            ::size((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                    *)local_30);
    if (sVar1 <= uStack_210) break;
    numDrawCalls = de::Random::getInt((Random *)((long)&ndx + 4),1,calibrationRoundNdx);
    dVar2 = deGetMicroseconds();
    render(this,numDrawCalls);
    dVar3 = deGetMicroseconds();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    dVar4 = deGetMicroseconds();
    readPixels(this);
    dVar5 = deGetMicroseconds();
    pvVar6 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_210);
    pvVar6->numDrawCalls = numDrawCalls;
    pvVar6 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_210);
    pvVar6->submitTime = dVar3 - dVar2;
    pvVar6 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_210);
    pvVar6->waitTime = dVar4 - dVar3;
    pvVar6 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_210);
    pvVar6->readPixelsTime = dVar5 - dVar4;
    tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    uStack_210 = uStack_210 + 1;
  }
  de::Random::~Random((Random *)((long)&ndx + 4));
  analyzeResults(this,(vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                       *)local_30,(CalibrationParams *)&stack0xffffffffffffffb0);
  rnd.m_rnd.z = 1;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ::~vector((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             *)local_30);
  return STOP;
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		setShaderIterCount(1);
		render(1);
		readPixels();
	}

	// Calibrate.
	for (int calibrationRoundNdx = 0; /* until done */; calibrationRoundNdx++)
	{
		try
		{
			m_testCtx.touchWatchdog();
			params = calibrate();
			verifyCalibration(params);
			break;
		}
		catch (const CalibrationFailedException& e)
		{
			m_testCtx.getLog() << e;

			if (calibrationRoundNdx < MAX_CALIBRATION_ATTEMPTS)
			{
				m_testCtx.getLog() << TestLog::Message
								   << "Retrying calibration (" << (calibrationRoundNdx+1) << " / " << (int)MAX_CALIBRATION_ATTEMPTS << ")"
								   << TestLog::EndMessage;
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
				return STOP;
			}
		}
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		setShaderIterCount(params.numItersInShader);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int		drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			const deUint64	submitStartTime	= deGetMicroseconds();
			deUint64		waitStartTime;
			deUint64		readStartTime;
			deUint64		readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].submitTime		= waitStartTime-submitStartTime;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			m_testCtx.touchWatchdog();
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}